

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O1

void __thiscall
QUrlModel::dataChanged(QUrlModel *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  int *piVar1;
  QAbstractItemModel *pQVar2;
  WatchItem *pWVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined8 local_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  long *local_68;
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (topLeft->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    local_48 = (undefined1 *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_58,pQVar2,topLeft);
  }
  if ((this->watching).d.size != 0) {
    lVar4 = 0x18;
    uVar5 = 0;
    do {
      pWVar3 = (this->watching).d.ptr;
      piVar1 = (int *)((long)pWVar3 + lVar4 + -0x18);
      local_78 = *piVar1;
      iStack_74 = piVar1[1];
      iStack_70 = piVar1[2];
      iStack_6c = piVar1[3];
      local_68 = *(long **)((long)pWVar3 + lVar4 + -8);
      if ((((topLeft->r <= local_78) && (local_78 <= bottomRight->r)) && (topLeft->c <= iStack_74))
         && (iStack_74 <= bottomRight->c)) {
        if (local_68 == (long *)0x0) {
          local_90 = 0xffffffffffffffff;
          local_88 = (undefined1 *)0x0;
          puStack_80 = (undefined1 *)0x0;
        }
        else {
          (**(code **)(*local_68 + 0x68))(&local_90,local_68,&local_78);
        }
        if ((int)local_90 == (int)local_58) {
          if (((local_90._4_4_ == local_58._4_4_) && (local_88 == puStack_50)) &&
             (puStack_80 == local_48)) {
            changed(this,(QString *)((long)&(((this->watching).d.ptr)->index).r + lVar4));
          }
        }
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x30;
    } while (uVar5 < (ulong)(this->watching).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlModel::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    QModelIndex parent = topLeft.parent();
    for (int i = 0; i < watching.size(); ++i) {
        QModelIndex index = watching.at(i).index;
        if (index.model() && topLeft.model()) {
            Q_ASSERT(index.model() == topLeft.model());
        }
        if (   index.row() >= topLeft.row()
            && index.row() <= bottomRight.row()
            && index.column() >= topLeft.column()
            && index.column() <= bottomRight.column()
            && index.parent() == parent) {
                changed(watching.at(i).path);
        }
    }
}